

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O0

Mat * IntArrayMat(int a0,int a1,int a2)

{
  int *piVar1;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  int *p;
  Mat *m;
  Mat *this;
  undefined8 in_stack_ffffffffffffffc8;
  Mat *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  ncnn::Mat::Mat(in_stack_ffffffffffffffd0,(int)((ulong)in_stack_ffffffffffffffc8 >> 0x20),
                 (size_t)in_RDI,(Allocator *)in_RDI);
  piVar1 = ncnn::Mat::operator_cast_to_int_(this);
  *piVar1 = in_ESI;
  piVar1[1] = in_EDX;
  piVar1[2] = in_ECX;
  return in_RDI;
}

Assistant:

static ncnn::Mat IntArrayMat(int a0, int a1, int a2)
{
    ncnn::Mat m(3);
    int* p = m;
    p[0] = a0;
    p[1] = a1;
    p[2] = a2;
    return m;
}